

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineOutputFile::copyPixels(DeepScanLineOutputFile *this,DeepScanLineInputFile *in)

{
  int *piVar1;
  int iVar2;
  LineOrder LVar3;
  Compression CVar4;
  Data *pDVar5;
  size_t __n;
  uint64_t sampleCountTableSize;
  uint64_t packedDataSize;
  uint64_t unpackedDataSize;
  OutputStreamMutex *filedata;
  DeepScanLineOutputFile *pDVar6;
  bool bVar7;
  int iVar8;
  Header *this_00;
  string *psVar9;
  Box2i *pBVar10;
  Box2i *pBVar11;
  LineOrder *pLVar12;
  Compression *pCVar13;
  ChannelList *this_01;
  ChannelList *other;
  char *pcVar14;
  ArgExc *pAVar15;
  ostream *poVar16;
  LogicExc *this_02;
  undefined4 in_ECX;
  char *pcVar17;
  value_type_conflict *__val;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  uint64_t dataSize;
  pthread_mutex_t *local_1c8;
  DeepScanLineOutputFile *local_1c0;
  stringstream _iex_throw_s;
  char *local_1a8 [47];
  
  local_1c8 = (pthread_mutex_t *)this->_data->_streamData;
  iVar8 = pthread_mutex_lock(local_1c8);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  pDVar5 = this->_data;
  this_00 = DeepScanLineInputFile::header(in);
  bVar7 = Header::hasType(this_00);
  if (!bVar7) {
LAB_0016c3dc:
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar14 = DeepScanLineInputFile::fileName(in);
    poVar16 = std::operator<<((ostream *)local_1a8,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\": the input needs to be a deep scanline image",0x2e);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  psVar9 = Header::type_abi_cxx11_(this_00);
  __n = psVar9->_M_string_length;
  if (__n != DAT_001e7c38) goto LAB_0016c3dc;
  if (__n != 0) {
    iVar8 = bcmp((psVar9->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
    if (iVar8 != 0) goto LAB_0016c3dc;
  }
  pBVar10 = Header::dataWindow(&pDVar5->header);
  pBVar11 = Header::dataWindow(this_00);
  iVar8 = -(uint)((pBVar11->min).x == (pBVar10->min).x);
  iVar20 = -(uint)((pBVar11->min).y == (pBVar10->min).y);
  auVar18._4_4_ = iVar8;
  auVar18._0_4_ = iVar8;
  auVar18._8_4_ = iVar20;
  auVar18._12_4_ = iVar20;
  iVar8 = movmskpd(in_ECX,auVar18);
  if ((iVar8 != 3) ||
     (iVar8 = -(uint)((pBVar11->max).x == (pBVar10->max).x),
     iVar20 = -(uint)((pBVar11->max).y == (pBVar10->max).y), auVar19._4_4_ = iVar8,
     auVar19._0_4_ = iVar8, auVar19._8_4_ = iVar20, auVar19._12_4_ = iVar20,
     iVar8 = movmskpd((int)pBVar11,auVar19), iVar8 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar14 = DeepScanLineInputFile::fileName(in);
    poVar16 = std::operator<<((ostream *)local_1a8,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\". The files have different data windows.",0x29);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pLVar12 = Header::lineOrder(&pDVar5->header);
  LVar3 = *pLVar12;
  pLVar12 = Header::lineOrder(this_00);
  if (LVar3 != *pLVar12) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar14 = DeepScanLineInputFile::fileName(in);
    poVar16 = std::operator<<((ostream *)local_1a8,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\" failed. The files have different line orders.",0x2f);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pCVar13 = Header::compression(&pDVar5->header);
  CVar4 = *pCVar13;
  pCVar13 = Header::compression(this_00);
  if (CVar4 != *pCVar13) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar14 = DeepScanLineInputFile::fileName(in);
    poVar16 = std::operator<<((ostream *)local_1a8,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\" failed. The files use different compression methods.",0x36);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  this_01 = Header::channels(&pDVar5->header);
  other = Header::channels(this_00);
  bVar7 = ChannelList::operator==(this_01,other);
  if (!bVar7) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar14 = DeepScanLineInputFile::fileName(in);
    poVar16 = std::operator<<((ostream *)local_1a8,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\" failed.  The files have different channel lists.",0x32);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pBVar10 = Header::dataWindow(&pDVar5->header);
  if (this->_data->missingScanLines != ((pBVar10->max).y - (pBVar10->min).y) + 1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar14 = DeepScanLineInputFile::fileName(in);
    poVar16 = std::operator<<((ostream *)local_1a8,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to image file \"",0x11);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" failed. \"",0xb);
    pcVar14 = OStream::fileName(this->_data->_streamData->os);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::LogicExc::LogicExc(this_02,(stringstream *)&_iex_throw_s);
    __cxa_throw(this_02,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
  }
  pcVar14 = (char *)operator_new(0x1000);
  pcVar17 = pcVar14 + 0x1000;
  __iex_throw_s = pcVar14;
  local_1a8[0] = pcVar17;
  memset(pcVar14,0,0x1000);
  if (0 < this->_data->missingScanLines) {
    iVar8 = this->_data->currentScanLine;
    local_1c0 = this;
    do {
      pDVar6 = local_1c0;
      dataSize = (long)pcVar17 - (long)__iex_throw_s;
      DeepScanLineInputFile::rawPixelData(in,iVar8,__iex_throw_s,&dataSize);
      if ((ulong)((long)pcVar17 - (long)__iex_throw_s) < dataSize) {
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&_iex_throw_s,dataSize);
        DeepScanLineInputFile::rawPixelData
                  (in,pDVar6->_data->currentScanLine,__iex_throw_s,&dataSize);
      }
      pcVar14 = __iex_throw_s;
      sampleCountTableSize = *(uint64_t *)(__iex_throw_s + 4);
      packedDataSize = *(uint64_t *)(__iex_throw_s + 0xc);
      unpackedDataSize = *(uint64_t *)(__iex_throw_s + 0x14);
      pDVar5 = pDVar6->_data;
      filedata = pDVar5->_streamData;
      iVar8 = lineBufferMinY(pDVar5->currentScanLine,pDVar5->minY,pDVar5->linesInBuffer);
      anon_unknown_7::writePixelData
                (filedata,pDVar5,iVar8,pcVar14 + sampleCountTableSize + 0x1c,packedDataSize,
                 unpackedDataSize,pcVar14 + 0x1c,sampleCountTableSize);
      pDVar5 = local_1c0->_data;
      iVar20 = pDVar5->linesInBuffer;
      iVar8 = -iVar20;
      if (pDVar5->lineOrder == INCREASING_Y) {
        iVar8 = iVar20;
      }
      iVar8 = iVar8 + pDVar5->currentScanLine;
      pDVar5->currentScanLine = iVar8;
      piVar1 = &pDVar5->missingScanLines;
      iVar2 = *piVar1;
      *piVar1 = *piVar1 - iVar20;
    } while (*piVar1 != 0 && SBORROW4(iVar2,iVar20) == *piVar1 < 0);
    pcVar14 = __iex_throw_s;
    if (__iex_throw_s == (char *)0x0) goto LAB_0016c3c0;
  }
  operator_delete(pcVar14,(long)local_1a8[0] - (long)pcVar14);
LAB_0016c3c0:
  pthread_mutex_unlock(local_1c8);
  return;
}

Assistant:

void
DeepScanLineOutputFile::copyPixels (DeepScanLineInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!inHdr.hasType () || inHdr.type () != DEEPSCANLINE)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\": the input needs to be a deep scanline image");
    }
    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed.  "
                   "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i& dataWindow = hdr.dataWindow ();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "\""
                << fileName ()
                << "\" already contains "
                   "pixel data.");

    //
    // Copy the pixel data.
    //

    vector<char> data (4096);

    while (_data->missingScanLines > 0)
    {
        uint64_t dataSize = (uint64_t) data.size ();
        in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            // block wasn't big enough - go again with enough memory this time
            data.resize (dataSize);
            in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        }

        // extract header from block to pass to writePixelData

        bytesOruint64_t tmp;
        memcpy (&tmp.b, &data[4], 8);
        uint64_t packedSampleCountSize = tmp.i;

        memcpy (&tmp.b, &data[12], 8);
        uint64_t packedDataSize = tmp.i;

        memcpy (&tmp.b, &data[20], 8);
        uint64_t unpackedDataSize = tmp.i;

        const char* sampleCountTable = &data[0] + 28;
        const char* pixelData        = sampleCountTable + packedSampleCountSize;

        writePixelData (
            _data->_streamData,
            _data,
            lineBufferMinY (
                _data->currentScanLine, _data->minY, _data->linesInBuffer),
            pixelData,
            packedDataSize,
            unpackedDataSize,
            sampleCountTable,
            packedSampleCountSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)
                                      ? _data->linesInBuffer
                                      : -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}